

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRHeadTrackingNode.cpp
# Opt level: O2

VRDisplayNode *
MinVR::VRHeadTrackingNode::create(VRMainInterface *vrMain,VRDataIndex *config,string *nameSpace)

{
  float fVar1;
  float fVar2;
  float r1c3;
  float r2c1;
  float r2c2;
  float r2c3;
  float r3c1;
  float r3c2;
  bool bVar3;
  VRAnyCoreType VVar4;
  float *pfVar5;
  ostream *poVar6;
  VRHeadTrackingNode *this;
  VRMatrix4 M1;
  VRVector3 z;
  VRVector3 x;
  VRVector3 eye;
  VRVector3 y;
  VRMatrix4 M2;
  VRVector3 up;
  string local_298;
  VRVector3 center;
  string local_260;
  VRMatrix4 headMatrix;
  VRMatrix4 lookAtMatrix;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string trackingEvent;
  VRMatrix4 local_b0;
  VRMatrix4 local_68;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&headMatrix,"HeadTrackingEvent",(allocator<char> *)&M1);
  std::__cxx11::string::string((string *)&local_f0,(string *)nameSpace);
  VVar4 = VRDataIndex::getValue(config,(string *)&headMatrix,&local_f0,true);
  (*(VVar4.datum)->_vptr_VRDatum[2])(&trackingEvent,VVar4.datum);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&headMatrix);
  VRMatrix4::VRMatrix4(&headMatrix);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&M1,"HeadMatrix",(allocator<char> *)&M2);
  std::__cxx11::string::string((string *)&local_110,(string *)nameSpace);
  bVar3 = VRDataIndex::exists(config,(string *)&M1,&local_110,true);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&M1);
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&M2,"HeadMatrix",(allocator<char> *)&lookAtMatrix);
    std::__cxx11::string::string((string *)&local_130,(string *)nameSpace);
    VVar4 = VRDataIndex::getValue(config,(string *)&M2,&local_130,true);
    VRMatrix4::VRMatrix4(&M1,VVar4);
    VRMatrix4::operator=(&headMatrix,&M1);
    VRMatrix4::~VRMatrix4(&M1);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&M2);
    goto LAB_001318f7;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&M1,"LookAtUp",(allocator<char> *)&local_b0);
  std::__cxx11::string::string((string *)&local_298,(string *)nameSpace);
  bVar3 = VRDataIndex::exists(config,(string *)&M1,&local_298,true);
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&M2,"LookAtEye",(allocator<char> *)&up);
    std::__cxx11::string::string((string *)&local_260,(string *)nameSpace);
    bVar3 = VRDataIndex::exists(config,(string *)&M2,&local_260,true);
    if (!bVar3) {
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&M2);
      goto LAB_00131884;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&lookAtMatrix,"LookAtCenter",(allocator<char> *)&eye);
    std::__cxx11::string::string((string *)&local_150,(string *)nameSpace);
    bVar3 = VRDataIndex::exists(config,(string *)&lookAtMatrix,&local_150,true);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&lookAtMatrix);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&M2);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&M1);
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&M1,"LookAtUp",(allocator<char> *)&M2);
      std::__cxx11::string::string((string *)&local_170,(string *)nameSpace);
      VVar4 = VRDataIndex::getValue(config,(string *)&M1,&local_170,true);
      VRVector3::VRVector3(&up,VVar4);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&M1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&M1,"LookAtEye",(allocator<char> *)&M2);
      std::__cxx11::string::string((string *)&local_190,(string *)nameSpace);
      VVar4 = VRDataIndex::getValue(config,(string *)&M1,&local_190,true);
      VRVector3::VRVector3(&eye,VVar4);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&M1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&M1,"LookAtCenter",(allocator<char> *)&M2);
      std::__cxx11::string::string((string *)&local_1b0,(string *)nameSpace);
      VVar4 = VRDataIndex::getValue(config,(string *)&M1,&local_1b0,true);
      VRVector3::VRVector3(&center,VVar4);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&M1);
      operator-(&z,&eye,&center);
      VRVector3::normalize((VRVector3 *)&M1,&z);
      VRVector3::operator=(&z,(VRVector3 *)&M1);
      VRVector3::~VRVector3((VRVector3 *)&M1);
      VRVector3::cross(&x,&up,&z);
      VRVector3::normalize((VRVector3 *)&M1,&x);
      VRVector3::operator=(&x,(VRVector3 *)&M1);
      VRVector3::~VRVector3((VRVector3 *)&M1);
      VRVector3::cross(&y,&z,&x);
      pfVar5 = VRVector3::operator[](&x,0);
      fVar1 = *pfVar5;
      pfVar5 = VRVector3::operator[](&y,0);
      fVar2 = *pfVar5;
      pfVar5 = VRVector3::operator[](&z,0);
      r1c3 = *pfVar5;
      pfVar5 = VRVector3::operator[](&x,1);
      r2c1 = *pfVar5;
      pfVar5 = VRVector3::operator[](&y,1);
      r2c2 = *pfVar5;
      pfVar5 = VRVector3::operator[](&z,1);
      r2c3 = *pfVar5;
      pfVar5 = VRVector3::operator[](&x,2);
      r3c1 = *pfVar5;
      pfVar5 = VRVector3::operator[](&y,2);
      r3c2 = *pfVar5;
      pfVar5 = VRVector3::operator[](&z,2);
      VRMatrix4::fromRowMajorElements
                (&M1,fVar1,fVar2,r1c3,0.0,r2c1,r2c2,r2c3,0.0,r3c1,r3c2,*pfVar5,0.0,0.0,0.0,0.0,1.0);
      pfVar5 = VRVector3::operator[](&eye,0);
      fVar1 = *pfVar5;
      pfVar5 = VRVector3::operator[](&eye,1);
      fVar2 = *pfVar5;
      pfVar5 = VRVector3::operator[](&eye,2);
      VRMatrix4::fromRowMajorElements
                (&M2,1.0,0.0,0.0,-fVar1,0.0,1.0,0.0,-fVar2,0.0,0.0,1.0,-*pfVar5,0.0,0.0,0.0,1.0);
      operator*(&lookAtMatrix,&M1,&M2);
      VRMatrix4::inverse(&local_b0,&lookAtMatrix);
      VRMatrix4::operator=(&headMatrix,&local_b0);
      VRMatrix4::~VRMatrix4(&local_b0);
      VRMatrix4::~VRMatrix4(&lookAtMatrix);
      VRMatrix4::~VRMatrix4(&M2);
      VRMatrix4::~VRMatrix4(&M1);
      VRVector3::~VRVector3(&y);
      VRVector3::~VRVector3(&x);
      VRVector3::~VRVector3(&z);
      VRVector3::~VRVector3(&center);
      VRVector3::~VRVector3(&eye);
      VRVector3::~VRVector3(&up);
      goto LAB_001318f7;
    }
  }
  else {
LAB_00131884:
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&M1);
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"Warning : no HeadMatrix defined for ");
  poVar6 = std::operator<<(poVar6,(string *)nameSpace);
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cerr,
                           "Either Define HeadMatrix or LookAtUp, LookAtEye and LookAtCenter");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cerr,
                           "Using IdentityMatrix as default 1,0,0,0, 0,1,0,0, 0,0,1,0, 0,0,0,1 ");
  std::endl<char,std::char_traits<char>>(poVar6);
LAB_001318f7:
  this = (VRHeadTrackingNode *)operator_new(0xe0);
  VRMatrix4::VRMatrix4(&local_68,&headMatrix);
  VRHeadTrackingNode(this,nameSpace,&trackingEvent,&local_68);
  VRMatrix4::~VRMatrix4(&local_68);
  (**vrMain->_vptr_VRMainInterface)(vrMain,&this->super_VREventHandler);
  VRMatrix4::~VRMatrix4(&headMatrix);
  std::__cxx11::string::~string((string *)&trackingEvent);
  return &this->super_VRDisplayNode;
}

Assistant:

VRDisplayNode* VRHeadTrackingNode::create(VRMainInterface *vrMain, VRDataIndex *config, const std::string &nameSpace) {

	std::string trackingEvent = config->getValue("HeadTrackingEvent", nameSpace);
	VRMatrix4 headMatrix;

	if (config->exists("HeadMatrix", nameSpace)){
		headMatrix = config->getValue("HeadMatrix", nameSpace);
	}
	else if (config->exists("LookAtUp", nameSpace) && config->exists("LookAtEye", nameSpace) && config->exists("LookAtCenter", nameSpace))
	{
		VRVector3 up = config->getValue("LookAtUp", nameSpace);
		VRVector3 eye = config->getValue("LookAtEye", nameSpace);
		VRVector3 center = config->getValue("LookAtCenter", nameSpace);

        VRVector3 z = eye - center;
		z = z.normalize();
		VRVector3 x = up.cross(z);
		x = x.normalize();
		VRVector3 y = z.cross(x);

        VRMatrix4 M1 = VRMatrix4::fromRowMajorElements(x[0], y[0], z[0], 0,
                                                       x[1], y[1], z[1], 0,
                                                       x[2], y[2], z[2], 0,
                                                       0, 0, 0, 1);

        VRMatrix4 M2 = VRMatrix4::fromRowMajorElements(1, 0, 0, -eye[0],
                                                       0, 1, 0, -eye[1],
                                                       0, 0, 1, -eye[2],
                                                       0, 0, 0, 1);

		VRMatrix4 lookAtMatrix = M1 * M2;
        headMatrix = lookAtMatrix.inverse();
	}
	else
	{
		std::cerr << "Warning : no HeadMatrix defined for " << nameSpace << std::endl;
		std::cerr << "Either Define HeadMatrix or LookAtUp, LookAtEye and LookAtCenter" << std::endl;
		std::cerr << "Using IdentityMatrix as default 1,0,0,0, 0,1,0,0, 0,0,1,0, 0,0,0,1 " << std::endl;
	}

	VRHeadTrackingNode *node = new VRHeadTrackingNode(nameSpace, trackingEvent, headMatrix);

	vrMain->addEventHandler(node);

	return node;
}